

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTagType
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Index index_00;
  bool bVar2;
  TagType local_108;
  undefined1 local_e0 [8];
  TagType tag_type;
  FuncType *func_type;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index sig_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = sig_index;
  local_1c = index;
  _sig_index_local = this;
  GetLocation(&local_48,this);
  index_00 = local_20;
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_90,index_00,(Location *)&func_type);
  local_24 = (Enum)SharedValidator::OnTag(&this->validator_,&local_48,&local_90);
  bVar2 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                  operator[](&this->module_->func_types,(ulong)local_20);
    TagType::TagType((TagType *)local_e0,Exception,
                     &((reference)
                      tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->params);
    pMVar1 = this->module_;
    TagType::TagType(&local_108,(TagType *)local_e0);
    std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::push_back
              (&pMVar1->tags,(value_type *)&local_108);
    TagDesc::~TagDesc((TagDesc *)&local_108);
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,(value_type *)local_e0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    TagType::~TagType((TagType *)local_e0);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnTagType(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.tags.push_back(TagDesc{tag_type});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}